

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# src_sinc.c
# Opt level: O3

void sinc_reset(SRC_STATE *state)

{
  void *pvVar1;
  
  pvVar1 = state->private_data;
  if (pvVar1 != (void *)0x0) {
    *(undefined8 *)((long)pvVar1 + 0x48) = 0;
    *(undefined4 *)((long)pvVar1 + 0x50) = 0xffffffff;
    *(undefined8 *)((long)pvVar1 + 0x30) = 0;
    *(undefined8 *)((long)pvVar1 + 0x38) = 0;
    memset(*(void **)((long)pvVar1 + 0x858),0,(long)*(int *)((long)pvVar1 + 0x54) << 2);
    memset((void *)((long)*(int *)((long)pvVar1 + 0x54) * 4 + *(long *)((long)pvVar1 + 0x858)),0xaa,
           (long)state->channels << 2);
    return;
  }
  return;
}

Assistant:

static void
sinc_reset (SRC_STATE *state)
{	SINC_FILTER *filter ;

	filter = (SINC_FILTER*) state->private_data ;
	if (filter == NULL)
		return ;

	filter->b_current = filter->b_end = 0 ;
	filter->b_real_end = -1 ;

	filter->src_ratio = filter->input_index = 0.0 ;

	memset (filter->buffer, 0, filter->b_len * sizeof (filter->buffer [0])) ;

	/* Set this for a sanity check */
	memset (filter->buffer + filter->b_len, 0xAA, state->channels * sizeof (filter->buffer [0])) ;
}